

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

TimeProcessingResult helics::processMessage(ActionMessage *cmd,DependencyInfo *dep)

{
  bool bVar1;
  action_t aVar2;
  int32_t iVar3;
  baseType *in_RSI;
  ActionMessage *in_RDI;
  bool delayed;
  TimeProcessingResult res;
  int32_t local_74;
  undefined1 local_6e;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_69;
  GlobalFederateId local_64;
  baseType local_60;
  baseType local_58;
  baseType local_50;
  GlobalFederateId local_44;
  baseType local_40;
  baseType local_38;
  baseType local_30;
  GlobalFederateId local_24;
  GlobalFederateId local_20;
  GlobalFederateId local_1c;
  GlobalFederateId local_18;
  undefined1 local_12;
  TimeProcessingResult local_11;
  baseType *local_10;
  ActionMessage *local_8;
  
  local_11 = PROCESSED;
  local_12 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  aVar2 = ActionMessage::action(in_RDI);
  if (((aVar2 == cmd_priority_disconnect) || (aVar2 == cmd_disconnect)) ||
     ((uint)(aVar2 + (cmd_route_ack|cmd_init)) < 4)) {
    *(undefined1 *)(local_10 + 6) = 5;
    local_30 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
    *local_10 = local_30;
    local_38 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
    local_10[1] = local_38;
    local_40 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
    local_10[2] = local_40;
    memset(&local_44,0,4);
    GlobalFederateId::GlobalFederateId(&local_44);
    *(BaseType *)(local_10 + 5) = local_44.gid;
    *(undefined4 *)(local_10 + 7) = 0;
    *(undefined1 *)((long)local_10 + 0x31) = 0;
    *(undefined1 *)((long)local_10 + 0x53) = 0;
  }
  else if (aVar2 == cmd_exec_request) {
    bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                      (local_8,iteration_requested_flag);
    if (bVar1) {
      bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>(local_8,required_flag);
      local_69 = 1;
      if (!bVar1) {
        local_69 = 2;
      }
      local_6b = local_69;
    }
    else {
      local_6b = 3;
    }
    *(undefined1 *)(local_10 + 6) = local_6b;
    local_12 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                         (local_8,delayed_timing_flag);
    if (((bool)local_12) && ((*(byte *)((long)local_10 + 0x33) & 1) == 0)) {
      local_11 = PROCESSED_AND_CHECK;
    }
    *(undefined1 *)((long)local_10 + 0x33) = local_12;
    *(char *)((long)local_10 + 0x35) = (char)local_8->messageID;
    *(uint *)((long)local_10 + 0x3c) = (uint)local_8->counter;
    iVar3 = ActionMessage::getExtraData((ActionMessage *)0x55db69);
    GlobalFederateId::GlobalFederateId(&local_18,iVar3);
    *(BaseType *)(local_10 + 5) = local_18.gid;
    iVar3 = ActionMessage::getExtraDestData((ActionMessage *)0x55db8b);
    *(int32_t *)(local_10 + 8) = iVar3;
    if (*(char *)((long)local_10 + 0x4d) == '\x03') {
      *(undefined4 *)(local_10 + 8) = *(undefined4 *)((long)local_10 + 0x3c);
    }
    if ((int)local_10[8] == *(int *)((long)local_10 + 0x44)) {
      *(undefined1 *)((long)local_10 + 0x53) = 0;
    }
  }
  else if (aVar2 == cmd_exec_grant) {
    bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                      (local_8,iteration_requested_flag);
    if (bVar1) {
      *(undefined1 *)(local_10 + 6) = 0;
      *(uint *)((long)local_10 + 0x3c) = (uint)local_8->counter;
      *(undefined4 *)(local_10 + 8) = 0;
      *(undefined1 *)((long)local_10 + 0x35) = 0;
    }
    else {
      *(undefined1 *)(local_10 + 6) = 5;
      *local_10 = 0;
      local_10[2] = 0;
      *(undefined4 *)(local_10 + 7) = 0;
      local_10[1] = 0;
      *(undefined4 *)((long)local_10 + 0x3c) = 0;
      *(undefined4 *)(local_10 + 8) = 0;
      *(undefined4 *)((long)local_10 + 0x44) = 0;
      *(undefined1 *)((long)local_10 + 0x35) = 0;
      memset(&local_1c,0,4);
      GlobalFederateId::GlobalFederateId(&local_1c);
      *(BaseType *)(local_10 + 5) = local_1c.gid;
    }
    *(undefined1 *)((long)local_10 + 0x31) = 0;
  }
  else if (aVar2 == cmd_time_grant) {
    *(undefined1 *)(local_10 + 6) = 5;
    *local_10 = (local_8->actionTime).internalTimeCode;
    local_10[1] = *local_10;
    local_10[2] = *local_10;
    memset(&local_24,0,4);
    GlobalFederateId::GlobalFederateId(&local_24);
    *(BaseType *)(local_10 + 5) = local_24.gid;
    *(undefined4 *)(local_10 + 7) = 0;
    *(undefined1 *)((long)local_10 + 0x32) = 0;
    *(uint *)((long)local_10 + 0x3c) = (uint)local_8->counter;
    *(undefined1 *)((long)local_10 + 0x31) = 0;
  }
  else if (aVar2 == cmd_request_current_time) {
    *(uint *)((long)local_10 + 0x3c) = (uint)local_8->counter;
  }
  else {
    if (aVar2 != cmd_pub) {
      if (aVar2 == cmd_timing_info) {
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (local_8,non_granting_flag);
        *(bool *)((long)local_10 + 0x51) = bVar1;
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (local_8,delayed_timing_flag);
        *(bool *)((long)local_10 + 0x33) = bVar1;
        iVar3 = ActionMessage::getExtraData((ActionMessage *)0x55e02b);
        *(char *)((long)local_10 + 0x34) = (char)iVar3;
        return PROCESSED_AND_CHECK;
      }
      if (aVar2 == cmd_time_request) {
        if ((char)local_10[6] == '\x05') {
          local_10[4] = *local_10;
          local_11 = PROCESSED_NEW_REQUEST;
        }
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (local_8,iteration_requested_flag);
        if (bVar1) {
          bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                            (local_8,required_flag);
          local_6c = 6;
          if (!bVar1) {
            local_6c = 7;
          }
          local_6e = local_6c;
        }
        else {
          local_6e = 8;
        }
        *(undefined1 *)(local_10 + 6) = local_6e;
        *local_10 = (local_8->actionTime).internalTimeCode;
        local_10[1] = (local_8->Te).internalTimeCode;
        local_10[2] = (local_8->Tdemin).internalTimeCode;
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)(local_10 + 1),
                           (TimeRepresentation<count_time<9,_long>_> *)(local_10 + 2));
        if (bVar1) {
          local_10[2] = local_10[1];
        }
        iVar3 = ActionMessage::getExtraData((ActionMessage *)0x55dda4);
        GlobalFederateId::GlobalFederateId(&local_20,iVar3);
        *(BaseType *)(local_10 + 5) = local_20.gid;
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(local_8,interrupted_flag)
        ;
        *(bool *)((long)local_10 + 0x32) = bVar1;
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (local_8,non_granting_flag);
        if (bVar1) {
          *(undefined1 *)((long)local_10 + 0x51) = 1;
        }
        local_12 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                             (local_8,delayed_timing_flag);
        if (((bool)local_12) && ((*(byte *)((long)local_10 + 0x33) & 1) == 0)) {
          local_11 = PROCESSED_AND_CHECK;
        }
        if ((bool)local_12) {
          *(undefined1 *)((long)local_10 + 0x33) = local_12;
        }
        bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                          (local_8,destination_target);
        *(bool *)((long)local_10 + 0x52) = bVar1;
        *(uint *)((long)local_10 + 0x3c) = (uint)local_8->counter;
        if (*(char *)((long)local_10 + 0x4d) == '\x03') {
          local_74 = *(int32_t *)((long)local_10 + 0x3c);
        }
        else {
          local_74 = ActionMessage::getExtraDestData((ActionMessage *)0x55de7a);
        }
        *(int32_t *)(local_10 + 8) = local_74;
        if ((int)local_10[8] != *(int *)((long)local_10 + 0x44)) {
          return local_11;
        }
        *(undefined1 *)((long)local_10 + 0x53) = 0;
        return local_11;
      }
      if ((aVar2 == cmd_local_error) || (aVar2 == cmd_global_error)) {
        *(undefined1 *)(local_10 + 6) = 10;
        local_50 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
        *local_10 = local_50;
        local_58 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
        local_10[1] = local_58;
        local_60 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
        local_10[2] = local_60;
        memset(&local_64,0,4);
        GlobalFederateId::GlobalFederateId(&local_64);
        *(BaseType *)(local_10 + 5) = local_64.gid;
        *(undefined4 *)(local_10 + 7) = 0;
        return local_11;
      }
      if (aVar2 != cmd_send_message) {
        return NOT_PROCESSED;
      }
    }
    *(undefined1 *)((long)local_10 + 0x31) = 1;
  }
  return local_11;
}

Assistant:

static TimeProcessingResult processMessage(const ActionMessage& cmd, DependencyInfo& dep)
{
    TimeProcessingResult res{TimeProcessingResult::PROCESSED};
    bool delayed{false};
    switch (cmd.action()) {
        case CMD_EXEC_REQUEST:
            dep.mTimeState = checkActionFlag(cmd, iteration_requested_flag) ?
                (checkActionFlag(cmd, required_flag) ? TimeState::exec_requested_require_iteration :
                                                       TimeState::exec_requested_iterative) :
                TimeState::exec_requested;
            delayed = checkActionFlag(cmd, delayed_timing_flag);
            if (delayed && !dep.delayedTiming) {
                res = TimeProcessingResult::PROCESSED_AND_CHECK;
            }
            dep.delayedTiming = delayed;
            dep.restrictionLevel = cmd.messageID;
            dep.sequenceCounter = cmd.counter;
            dep.minFed = GlobalFederateId(cmd.getExtraData());
            dep.responseSequenceCounter = cmd.getExtraDestData();
            if (dep.connection == ConnectionType::SELF) {
                dep.responseSequenceCounter = dep.sequenceCounter;
            }
            if (dep.responseSequenceCounter == dep.grantedIteration) {
                dep.updateRequested = false;
            }
            break;
        case CMD_EXEC_GRANT:
            if (!checkActionFlag(cmd, iteration_requested_flag)) {
                dep.mTimeState = TimeState::time_granted;
                dep.next = timeZero;
                dep.minDe = timeZero;
                dep.timeoutCount = 0;
                dep.Te = timeZero;
                dep.sequenceCounter = 0;
                dep.responseSequenceCounter = 0;
                dep.grantedIteration = 0;
                dep.restrictionLevel = 0;
                dep.minFed = GlobalFederateId{};
            } else {
                dep.mTimeState = TimeState::initialized;
                dep.sequenceCounter = cmd.counter;
                dep.responseSequenceCounter = 0;
                dep.restrictionLevel = 0;
            }
            dep.hasData = false;
            break;
        case CMD_TIME_REQUEST:
            if (dep.mTimeState == TimeState::time_granted) {
                dep.lastGrant = dep.next;
                res = TimeProcessingResult::PROCESSED_NEW_REQUEST;
            }
            dep.mTimeState = checkActionFlag(cmd, iteration_requested_flag) ?
                (checkActionFlag(cmd, required_flag) ? TimeState::time_requested_require_iteration :
                                                       TimeState::time_requested_iterative) :
                TimeState::time_requested;
            //   printf("%d Request from %d time %f, te=%f, Tdemin=%f\n", fedID, m.source_id,
            //   static_cast<double>(m.actionTime), static_cast<double>(m.Te),
            //   static_cast<double>(m.Tdemin)); assert(m.actionTime >= Tnext);
            dep.next = cmd.actionTime;
            dep.Te = cmd.Te;
            dep.minDe = cmd.Tdemin;

            if (dep.Te < dep.minDe) {
                dep.minDe = dep.Te;
            }

            dep.minFed = GlobalFederateId(cmd.getExtraData());
            dep.interrupted = checkActionFlag(cmd, interrupted_flag);

            // NEXT version this gets moved out of here
            if (checkActionFlag(cmd, non_granting_flag)) {
                dep.nonGranting = true;
            }

            delayed = checkActionFlag(cmd, delayed_timing_flag);
            if (delayed && !dep.delayedTiming) {
                res = TimeProcessingResult::PROCESSED_AND_CHECK;
            }
            if (delayed) {
                dep.delayedTiming = delayed;
            }
            // END remove block

            dep.triggered = checkActionFlag(cmd, destination_target);
            dep.sequenceCounter = cmd.counter;
            dep.responseSequenceCounter = (dep.connection != ConnectionType::SELF) ?
                cmd.getExtraDestData() :
                dep.sequenceCounter;
            if (dep.responseSequenceCounter == dep.grantedIteration) {
                dep.updateRequested = false;
            }
            break;
        case CMD_TIME_GRANT:
            dep.mTimeState = TimeState::time_granted;
            //    printf("%d Grant from %d time %f\n", fedID, m.source_id,
            //    static_cast<double>(m.actionTime));
            //   assert(m.actionTime >= Tnext);
            dep.next = cmd.actionTime;
            dep.Te = dep.next;
            dep.minDe = dep.next;
            dep.minFed = GlobalFederateId{};
            dep.timeoutCount = 0;
            dep.interrupted = false;
            dep.sequenceCounter = cmd.counter;
            dep.hasData = false;
            break;
        case CMD_DISCONNECT:
        case CMD_PRIORITY_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_FED:
            dep.mTimeState = TimeState::time_granted;
            //   printf("%d disconnect from %d\n", fedID, m.source_id);
            dep.next = Time::maxVal();
            dep.Te = Time::maxVal();
            dep.minDe = Time::maxVal();
            dep.minFed = GlobalFederateId{};
            dep.timeoutCount = 0;
            dep.hasData = false;
            dep.updateRequested = false;
            break;
        case CMD_TIMING_INFO:
            dep.nonGranting = checkActionFlag(cmd, non_granting_flag);
            dep.delayedTiming = checkActionFlag(cmd, delayed_timing_flag);
            dep.timingVersion = static_cast<std::uint8_t>(cmd.getExtraData());
            res = TimeProcessingResult::PROCESSED_AND_CHECK;
            break;
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
            dep.mTimeState = TimeState::error;
            //   printf("%d disconnect from %d\n", fedID, m.source_id);
            dep.next = Time::maxVal();
            dep.Te = Time::maxVal();
            dep.minDe = Time::maxVal();
            dep.minFed = GlobalFederateId{};
            dep.timeoutCount = 0;
            break;
        case CMD_SEND_MESSAGE:
        case CMD_PUB:
            dep.hasData = true;
            break;
        case CMD_REQUEST_CURRENT_TIME:
            dep.sequenceCounter = cmd.counter;
            break;
        default:
            res = TimeProcessingResult::NOT_PROCESSED;
            break;
    }
    return res;
}